

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreInstPrinter.c
# Opt level: O0

void XCore_insn_extract(MCInst *MI,char *code)

{
  cs_detail *pcVar1;
  xcore_reg xVar2;
  int iVar3;
  char *pcVar4;
  uint8_t *puVar5;
  bool bVar6;
  char local_b8 [8];
  char tmp [128];
  char *local_30;
  char *p2;
  char *p;
  int id;
  char *code_local;
  MCInst *MI_local;
  
  strcpy(local_b8,code);
  pcVar4 = strchr(local_b8,0x20);
  if (pcVar4 != (char *)0x0) {
    pcVar4 = pcVar4 + 1;
    local_30 = strchr(pcVar4,0x2c);
    if (local_30 == (char *)0x0) {
      xVar2 = XCore_reg_id(pcVar4);
      if ((xVar2 != XCORE_REG_INVALID) && (MI->csh->detail != CS_OPT_OFF)) {
        puVar5 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x12;
        puVar5[0] = '\x01';
        puVar5[1] = '\0';
        puVar5[2] = '\0';
        puVar5[3] = '\0';
        *(xcore_reg *)
         (MI->flat_insn->detail->groups +
         (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x16) = xVar2;
        pcVar1 = MI->flat_insn->detail;
        (pcVar1->field_6).x86.prefix[0] = (pcVar1->field_6).x86.prefix[0] + '\x01';
      }
    }
    else {
      *local_30 = '\0';
      xVar2 = XCore_reg_id(pcVar4);
      if ((xVar2 != XCORE_REG_INVALID) && (MI->csh->detail != CS_OPT_OFF)) {
        puVar5 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x12;
        puVar5[0] = '\x01';
        puVar5[1] = '\0';
        puVar5[2] = '\0';
        puVar5[3] = '\0';
        *(xcore_reg *)
         (MI->flat_insn->detail->groups +
         (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x16) = xVar2;
        pcVar1 = MI->flat_insn->detail;
        (pcVar1->field_6).x86.prefix[0] = (pcVar1->field_6).x86.prefix[0] + '\x01';
      }
      do {
        local_30 = local_30 + 1;
        bVar6 = false;
        if (*local_30 != '\0') {
          bVar6 = *local_30 == ' ';
        }
      } while (bVar6);
      if (*local_30 != '\0') {
        p2 = local_30;
        while( true ) {
          bVar6 = false;
          if (*p2 != '\0') {
            bVar6 = *p2 != '[';
          }
          if (!bVar6) break;
          p2 = p2 + 1;
        }
        if (*p2 == '\0') {
          xVar2 = XCore_reg_id(local_30);
          if ((xVar2 != XCORE_REG_INVALID) && (MI->csh->detail != CS_OPT_OFF)) {
            puVar5 = MI->flat_insn->detail->groups +
                     (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x12;
            puVar5[0] = '\x01';
            puVar5[1] = '\0';
            puVar5[2] = '\0';
            puVar5[3] = '\0';
            *(xcore_reg *)
             (MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x16) = xVar2;
            pcVar1 = MI->flat_insn->detail;
            (pcVar1->field_6).x86.prefix[0] = (pcVar1->field_6).x86.prefix[0] + '\x01';
          }
        }
        else {
          *p2 = '\0';
          xVar2 = XCore_reg_id(local_30);
          if (xVar2 != XCORE_REG_INVALID) {
            if (MI->csh->detail != CS_OPT_OFF) {
              puVar5 = MI->flat_insn->detail->groups +
                       (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x12;
              puVar5[0] = '\x03';
              puVar5[1] = '\0';
              puVar5[2] = '\0';
              puVar5[3] = '\0';
              MI->flat_insn->detail->groups
              [(ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x16] = (uint8_t)xVar2
              ;
              MI->flat_insn->detail->groups
              [(ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x17] = '\0';
              puVar5 = MI->flat_insn->detail->groups +
                       (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x1a;
              puVar5[0] = '\0';
              puVar5[1] = '\0';
              puVar5[2] = '\0';
              puVar5[3] = '\0';
              puVar5 = MI->flat_insn->detail->groups +
                       (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x1e;
              puVar5[0] = '\x01';
              puVar5[1] = '\0';
              puVar5[2] = '\0';
              puVar5[3] = '\0';
            }
            pcVar4 = p2 + 1;
            p2 = pcVar4;
            while( true ) {
              bVar6 = false;
              if (*p2 != '\0') {
                bVar6 = *p2 != ']';
              }
              if (!bVar6) break;
              p2 = p2 + 1;
            }
            if (*p2 != '\0') {
              *p2 = '\0';
              xVar2 = XCore_reg_id(pcVar4);
              if (xVar2 == XCORE_REG_INVALID) {
                if (MI->csh->detail != CS_OPT_OFF) {
                  iVar3 = atoi(pcVar4);
                  *(int *)(MI->flat_insn->detail->groups +
                          (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x1a) =
                       iVar3;
                }
              }
              else if (MI->csh->detail != CS_OPT_OFF) {
                MI->flat_insn->detail->groups
                [(ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x10 + 0x17] =
                     (uint8_t)xVar2;
              }
            }
            if (MI->csh->detail != CS_OPT_OFF) {
              pcVar1 = MI->flat_insn->detail;
              (pcVar1->field_6).x86.prefix[0] = (pcVar1->field_6).x86.prefix[0] + '\x01';
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void XCore_insn_extract(MCInst *MI, const char *code)
{
	int id;
	char *p, *p2;
	char tmp[128];

// make MSVC shut up on strcpy()
#ifdef _MSC_VER
#pragma warning(push)
#pragma warning(disable : 4996)
#endif
	strcpy(tmp, code); // safe because code is way shorter than 128 bytes
#ifdef _MSC_VER
#pragma warning(pop)
#endif

	// find the first space
	p = strchr(tmp, ' ');
	if (p) {
		p++;
		// find the next ','
		p2 = strchr(p, ',');
		if (p2) {
			*p2 = '\0';
			id = XCore_reg_id(p);
			if (id) {
				// register
				if (MI->csh->detail) {
					MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_REG;
					MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].reg = id;
					MI->flat_insn->detail->xcore.op_count++;
				}
			}
			// next should be register, or memory?
			// skip space
			p2++;
			while(*p2 && *p2 == ' ')
				p2++;
			if (*p2) {
				// find '['
				p = p2;
				while(*p && *p != '[')
					p++;
				if (*p) {
					// this is '['
					*p = '\0';
					id = XCore_reg_id(p2);
					if (id) {
						// base register
						if (MI->csh->detail) {
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_MEM;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.base = id;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.index = XCORE_REG_INVALID;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.disp = 0;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.direct = 1;
						}

						p++;
						p2 = p;
						// until ']'
						while(*p && *p != ']')
							p++;
						if (*p) {
							*p = '\0';
							// p2 is either index, or disp
							id = XCore_reg_id(p2);
							if (id) {
								// index register
								if (MI->csh->detail) {
									MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.index = id;
								}
							} else {
								// a number means disp
								if (MI->csh->detail) {
									MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.disp = atoi(p2);
								}
							}
						}

						if (MI->csh->detail) {
							MI->flat_insn->detail->xcore.op_count++;
						}
					}
				} else {
					// a register?
					id = XCore_reg_id(p2);
					if (id) {
						// register
						if (MI->csh->detail) {
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_REG;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].reg = id;
							MI->flat_insn->detail->xcore.op_count++;
						}
					}
				}
			}
		} else {
			id = XCore_reg_id(p);
			if (id) {
				// register
				if (MI->csh->detail) {
					MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_REG;
					MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].reg = id;
					MI->flat_insn->detail->xcore.op_count++;
				}
			}
		}
	}
}